

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_set_buffer_size(pcap_t *p,int buffer_size)

{
  int iVar1;
  int buffer_size_local;
  pcap_t *p_local;
  
  iVar1 = pcap_check_activated(p);
  if (iVar1 == 0) {
    if (buffer_size < 1) {
      p_local._4_4_ = 0;
    }
    else {
      (p->opt).buffer_size = buffer_size;
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = -4;
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_set_buffer_size(pcap_t *p, int buffer_size)
{
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);
	if (buffer_size <= 0) {
		/*
		 * Silently ignore invalid values.
		 */
		return (0);
	}
	p->opt.buffer_size = buffer_size;
	return (0);
}